

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

bool __thiscall
irr::gui::CGUITabControl::needScrollControl
          (CGUITabControl *this,s32 startIndex,bool withScrollControl,s32 *pos_rightmost)

{
  pointer ppIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  pointer ppIVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  if (startIndex < 1) {
    startIndex = 0;
  }
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar5 != (long *)0x0) {
    plVar5 = (long *)(**(code **)(*plVar5 + 0x30))(plVar5,0);
    ppIVar6 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppIVar1 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (plVar5 != (long *)0x0 && ppIVar6 != ppIVar1) {
      if (withScrollControl) {
        iVar9 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X + -2;
      }
      else {
        iVar9 = *(int *)&this->field_0x48;
      }
      iVar8 = *(int *)&this->field_0x40 + 2;
      if (startIndex < (int)((ulong)((long)ppIVar1 - (long)ppIVar6) >> 3)) {
        uVar7 = (ulong)(uint)startIndex;
        do {
          if (ppIVar6[uVar7] != (IGUITab *)0x0) {
            iVar3 = (*(ppIVar6[uVar7]->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
                      [0x15])();
            iVar4 = (**(code **)(*plVar5 + 8))(plVar5,iVar3);
            iVar4 = iVar4 + this->TabExtraWidth;
            iVar3 = this->TabMaxWidth;
            iVar2 = iVar3;
            if (iVar4 < iVar3) {
              iVar2 = iVar4;
            }
            if (iVar3 < 1) {
              iVar2 = iVar4;
            }
            iVar8 = iVar8 + iVar2;
          }
          if (iVar9 < iVar8) {
            return true;
          }
          uVar7 = uVar7 + 1;
          ppIVar6 = (this->Tabs).m_data.
                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while ((int)uVar7 <
                 (int)((ulong)((long)(this->Tabs).m_data.
                                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >>
                      3));
      }
      if (pos_rightmost != (s32 *)0x0) {
        *pos_rightmost = iVar8;
      }
    }
  }
  return false;
}

Assistant:

bool CGUITabControl::needScrollControl(s32 startIndex, bool withScrollControl, s32 *pos_rightmost)
{
	if (startIndex < 0)
		startIndex = 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();

	if (Tabs.empty())
		return false;

	if (!font)
		return false;

	s32 pos = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = withScrollControl ? UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 : AbsoluteRect.LowerRightCorner.X;

	for (s32 i = startIndex; i < (s32)Tabs.size(); ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i]) {
			text = Tabs[i]->getText();

			// get text length
			s32 len = calcTabWidth(font, text); // always without withScrollControl here or len would be shortened
			pos += len;
		}

		if (pos > pos_right)
			return true;
	}

	if (pos_rightmost)
		*pos_rightmost = pos;
	return false;
}